

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kdasm.c
# Opt level: O3

void d68000_movem_re_16(void)

{
  uint uVar1;
  uint uVar2;
  size_t sVar3;
  char *pcVar4;
  uint uVar5;
  uint in_EDI;
  int iVar6;
  int iVar7;
  uint uVar8;
  char buffer [40];
  char local_58 [40];
  
  uVar1 = dasm_read_imm_16(in_EDI);
  local_58[0] = '\0';
  uVar8 = 0;
  do {
    uVar5 = uVar8;
    if ((uVar1 >> (uVar8 & 0x1f) & 1) != 0) {
      if (uVar8 == 7) {
        uVar5 = 7;
        iVar6 = 0;
      }
      else {
        uVar2 = 6;
        if (6 < uVar8) {
          uVar2 = uVar8;
        }
        iVar7 = 0;
        do {
          uVar5 = iVar7 + uVar8;
          iVar6 = iVar7;
          if ((uVar1 >> ((byte)(iVar7 + uVar8) & 0x1f) & 2) == 0) break;
          iVar7 = iVar7 + 1;
          uVar5 = uVar2 + 1;
          iVar6 = (uVar2 + 1) - uVar8;
        } while (~uVar2 + uVar8 + iVar7 != 0);
      }
      if (local_58[0] != '\0') {
        sVar3 = strlen(local_58);
        (local_58 + sVar3)[0] = '/';
        (local_58 + sVar3)[1] = '\0';
      }
      sVar3 = strlen(local_58);
      sprintf(local_58 + sVar3,"D%d",(ulong)uVar8);
      if (iVar6 != 0) {
        sVar3 = strlen(local_58);
        sprintf(local_58 + sVar3,"-D%d",(ulong)(iVar6 + uVar8));
      }
    }
    uVar8 = uVar5 + 1;
  } while (uVar5 < 7);
  uVar8 = 0;
  do {
    uVar5 = uVar8;
    if (((uVar1 >> ((byte)uVar8 & 0x1f)) >> 8 & 1) != 0) {
      if (uVar8 == 7) {
        uVar5 = 7;
        iVar6 = 0;
      }
      else {
        uVar2 = 6;
        if (6 < uVar8) {
          uVar2 = uVar8;
        }
        iVar7 = 0;
        do {
          uVar5 = iVar7 + uVar8;
          iVar6 = iVar7;
          if (((uVar1 >> ((byte)(iVar7 + uVar8) & 0x1f)) >> 9 & 1) == 0) break;
          iVar7 = iVar7 + 1;
          uVar5 = uVar2 + 1;
          iVar6 = (uVar2 + 1) - uVar8;
        } while (~uVar2 + uVar8 + iVar7 != 0);
      }
      if (local_58[0] != '\0') {
        sVar3 = strlen(local_58);
        (local_58 + sVar3)[0] = '/';
        (local_58 + sVar3)[1] = '\0';
      }
      sVar3 = strlen(local_58);
      sprintf(local_58 + sVar3,"A%d",(ulong)uVar8);
      if (iVar6 != 0) {
        sVar3 = strlen(local_58);
        sprintf(local_58 + sVar3,"-A%d",(ulong)(iVar6 + uVar8));
      }
    }
    uVar8 = uVar5 + 1;
    if (6 < uVar5) {
      pcVar4 = get_ea_mode_str(g_cpu_ir,1);
      sprintf(g_dasm_str,"movem.w %s, %s",local_58,pcVar4);
      return;
    }
  } while( true );
}

Assistant:

static void d68000_movem_re_16(void)
{
	uint data = read_imm_16();
	char buffer[40];
	uint first;
	uint run_length;
	uint i;

	buffer[0] = 0;
	for(i=0;i<8;i++)
	{
		if(data&(1<<i))
		{
			first = i;
			run_length = 0;
			while(i<7 && (data&(1<<(i+1))))
			{
				i++;
				run_length++;
			}
			if(buffer[0] != 0)
				strcat(buffer, "/");
			sprintf(buffer+strlen(buffer), "D%d", first);
			if(run_length > 0)
				sprintf(buffer+strlen(buffer), "-D%d", first + run_length);
		}
	}
	for(i=0;i<8;i++)
	{
		if(data&(1<<(i+8)))
		{
			first = i;
			run_length = 0;
			while(i<7 && (data&(1<<(i+8+1))))
			{
				i++;
				run_length++;
			}
			if(buffer[0] != 0)
				strcat(buffer, "/");
			sprintf(buffer+strlen(buffer), "A%d", first);
			if(run_length > 0)
				sprintf(buffer+strlen(buffer), "-A%d", first + run_length);
		}
	}
	sprintf(g_dasm_str, "movem.w %s, %s", buffer, get_ea_mode_str_16(g_cpu_ir));
}